

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * whereForeignKeys(Parse *pParse,Table *pTab)

{
  HashElem *pHVar1;
  char *zWhere;
  long in_RDX;
  undefined8 *puVar2;
  
  zWhere = (char *)0x0;
  pHVar1 = findElementWithHash((Hash *)(in_RDX + 0x50),(char *)pTab,(uint *)0x0);
  puVar2 = (undefined8 *)pHVar1->data;
  if (puVar2 != (undefined8 *)0x0) {
    zWhere = (char *)0x0;
    do {
      zWhere = whereOrName(pParse->db,zWhere,*(char **)*puVar2);
      puVar2 = (undefined8 *)puVar2[3];
    } while (puVar2 != (undefined8 *)0x0);
  }
  return zWhere;
}

Assistant:

static char *whereForeignKeys(Parse *pParse, Table *pTab){
  FKey *p;
  char *zWhere = 0;
  for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
    zWhere = whereOrName(pParse->db, zWhere, p->pFrom->zName);
  }
  return zWhere;
}